

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> *
createSensorValueData
          (vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           *__return_storage_ptr__,int64_t now,int dataCount)

{
  ostream *poVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double local_a0;
  double local_98;
  double local_88;
  SensorValues local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  reserve(__return_storage_ptr__,(long)dataCount);
  uVar4 = (ulong)(uint)dataCount;
  if (dataCount < 1) {
    uVar4 = 0;
  }
  lVar5 = now + -0x3d4;
  local_88 = 1e-06;
  uVar3 = 1;
  local_a0 = 0.0;
  local_98 = 0.0;
  uVar2 = 0;
  while( true ) {
    if (uVar4 == uVar2) break;
    local_a0 = local_a0 + local_88;
    if (((0.0 < local_88) && (0.01 < local_a0)) || ((local_88 < 0.0 && (local_a0 < -0.01)))) {
      local_88 = -local_88;
    }
    local_98 = local_98 + local_a0;
    if (((uVar3 / 100000) * 100000 - 0x20 | 0x1f) == (uint)uVar2) {
      poVar1 = std::operator<<((ostream *)&std::cout,"index ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(uVar2 + 1));
      std::operator<<(poVar1,": v=");
      poVar1 = std::ostream::_M_insert<double>(local_98);
      std::operator<<(poVar1,", delta=");
      poVar1 = std::ostream::_M_insert<double>(local_a0);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    local_78.id = 0xffffffffffffffff;
    local_78.temperatureOutside = local_98 + 19.5;
    local_78.time = lVar5;
    dVar6 = cos(local_98);
    local_78.temperatureInside = dVar6 * local_98 + 23.3;
    dVar6 = sin(local_98);
    local_78.temperatureCpu = dVar6 * local_98 + 42.75;
    local_78.loadCpu1 = 0.8 - local_98;
    local_78.loadCpu2 = 0.7 - local_98;
    local_78.loadCpu3 = 0.6 - local_98;
    local_78.loadCpu4 = 0.5 - local_98;
    std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>::
    emplace_back<objectbox::tsdemo::SensorValues&>
              ((vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>
                *)__return_storage_ptr__,&local_78);
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x14;
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SensorValues> createSensorValueData(int64_t now, int dataCount) {
    std::vector<SensorValues> values;
    values.reserve(dataCount);
    double deltaDelta = 0.000001;
    double delta = 0.0;
    double value = 0.0;
    for (int i = 1; i <= dataCount; ++i) {
        delta += deltaDelta;
        value += delta;
        if ((delta > 0.01 && deltaDelta > 0) || (delta < -0.01 && deltaDelta < 0)) {
            deltaDelta = -deltaDelta;
        }
        if (i % 100000 == 0) std::cout << "index " << i << ": v=" << value << ", delta=" << delta << std::endl;

        SensorValues sensorValues{OBX_ID_NEW,
                                  now - 1000 + i * 20,
                                  19.5 + value,
                                  23.3 + value * cos(value),
                                  42.75 + value * sin(value),
                                  0.80 - value,
                                  0.7 - value,
                                  0.6 - value,
                                  0.5 - value};
        values.emplace_back(sensorValues);
    }
    return values;
}